

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int xmlParse3986URIReference(xmlURIPtr uri,char *str)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  uint uVar7;
  long lVar8;
  xmlChar *local_48;
  xmlChar *local_40;
  xmlChar *local_38;
  
  if (str == (char *)0x0) {
    return -1;
  }
  xmlCleanURI(uri);
  local_40 = (xmlChar *)str;
  if ((byte)((*str & 0xdfU) + 0xbf) < 0x1a) {
    lVar8 = 1;
    while (((bVar1 = str[lVar8], (byte)(bVar1 - 0x30) < 10 || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)
            ) || ((bVar1 < 0x2f && ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0))))) {
      lVar8 = lVar8 + 1;
    }
    if (uri != (xmlURIPtr)0x0) {
      if (uri->scheme != (char *)0x0) {
        (*xmlFree)(uri->scheme);
      }
      pxVar5 = xmlStrndup((xmlChar *)str,(int)lVar8);
      uri->scheme = (char *)pxVar5;
      if (pxVar5 == (xmlChar *)0x0) {
        iVar3 = -1;
        goto LAB_00151337;
      }
    }
    local_40 = (xmlChar *)(str + lVar8);
    iVar3 = 0;
    bVar2 = true;
  }
  else {
    iVar3 = 1;
LAB_00151337:
    bVar2 = false;
  }
  pxVar5 = local_40;
  if ((bVar2) && (iVar3 = 1, *local_40 == ':')) {
    pxVar6 = local_40 + 1;
    bVar1 = local_40[1];
    local_48 = pxVar6;
    if (bVar1 == 0x2f) {
      if (local_40[2] == '/') {
        local_48 = local_40 + 3;
        local_40 = pxVar6;
        iVar3 = xmlParse3986Authority(uri,(char **)&local_48);
        if (iVar3 == 0) {
          if ((uri->server == (char *)0x0) && (uri->port == 0)) {
            uri->port = -1;
          }
          iVar3 = xmlParse3986PathAbEmpty(uri,(char **)&local_48);
          goto LAB_00151454;
        }
      }
      else {
        local_40 = pxVar6;
        iVar3 = xmlParse3986PathAbsolute(uri,(char **)&local_48);
LAB_00151454:
        if (iVar3 == 0) goto LAB_0015159f;
      }
    }
    else {
      local_40 = pxVar6;
      iVar3 = xmlIsUnreserved(uri,(char *)pxVar6);
      if ((iVar3 == 0) &&
         ((uVar7 = bVar1 - 0x21, 0x1f < uVar7 ||
          (((0x96000fe9U >> (uVar7 & 0x1f) & 1) == 0 &&
           (((uVar7 != 4 ||
             ((bVar1 = pxVar5[2], 9 < (byte)(bVar1 - 0x30) &&
              ((uVar7 = bVar1 - 0x41, 0x25 < uVar7 ||
               ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) == 0)))))) ||
            ((bVar1 = pxVar5[3], 9 < (byte)(bVar1 - 0x30) &&
             ((uVar7 = bVar1 - 0x41, 0x25 < uVar7 ||
              ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) == 0)))))))))))) {
        if (uri != (xmlURIPtr)0x0) {
          if (uri->path != (char *)0x0) {
            (*xmlFree)(uri->path);
          }
          uri->path = (char *)0x0;
        }
      }
      else {
        bVar2 = false;
        local_38 = pxVar6;
        iVar3 = xmlParse3986Segment(uri,(char **)&local_38,'\0',0);
        if (iVar3 == 0) {
          bVar2 = false;
          do {
            pxVar5 = local_38;
            if (*local_38 != '/') {
              iVar3 = (int)local_38;
              if (uri != (xmlURIPtr)0x0) {
                if (uri->path != (char *)0x0) {
                  (*xmlFree)(uri->path);
                }
                if (pxVar5 == pxVar6) {
                  uri->path = (char *)0x0;
                }
                else {
                  iVar3 = iVar3 - (int)pxVar6;
                  if ((uri->cleanup & 2) == 0) {
                    pxVar6 = (xmlChar *)xmlURIUnescapeString((char *)pxVar6,iVar3,(char *)0x0);
                  }
                  else {
                    pxVar6 = xmlStrndup(pxVar6,iVar3);
                  }
                  uri->path = (char *)pxVar6;
                  if (pxVar6 == (xmlChar *)0x0) {
                    iVar3 = -1;
                    bVar2 = false;
                    break;
                  }
                }
              }
              local_48 = pxVar5;
              iVar3 = 0;
              bVar2 = true;
              break;
            }
            local_38 = local_38 + 1;
            iVar3 = 1;
            iVar4 = xmlParse3986Segment(uri,(char **)&local_38,'\0',1);
          } while (iVar4 == 0);
        }
        else {
          iVar3 = 1;
        }
        if (!bVar2) goto LAB_001515ab;
      }
LAB_0015159f:
      local_40 = local_48;
      iVar3 = 0;
    }
LAB_001515ab:
    if (iVar3 == 0) {
      if (*local_40 == '?') {
        local_40 = local_40 + 1;
        iVar4 = xmlParse3986Query(uri,(char **)&local_40);
        iVar3 = -1;
        if (iVar4 != 0) goto LAB_001515b4;
      }
      if (*local_40 == '#') {
        local_40 = local_40 + 1;
        iVar4 = xmlParse3986Fragment(uri,(char **)&local_40);
        iVar3 = -1;
        if (iVar4 != 0) goto LAB_001515b4;
      }
      if (*local_40 == '\0') {
        iVar3 = 0;
      }
      else {
        xmlCleanURI(uri);
        iVar3 = 1;
      }
    }
  }
LAB_001515b4:
  if (iVar3 < 0) {
    return iVar3;
  }
  if (iVar3 == 0) {
    return 0;
  }
  xmlCleanURI(uri);
  bVar1 = *str;
  local_48 = (xmlChar *)str;
  if (bVar1 == 0x2f) {
    if (str[1] == '/') {
      local_48 = (xmlChar *)(str + 2);
      iVar3 = xmlParse3986Authority(uri,(char **)&local_48);
      if (iVar3 != 0) goto LAB_00151881;
      iVar3 = xmlParse3986PathAbEmpty(uri,(char **)&local_48);
    }
    else {
      iVar3 = xmlParse3986PathAbsolute(uri,(char **)&local_48);
    }
    if (iVar3 != 0) goto LAB_00151881;
  }
  else {
    iVar3 = xmlIsUnreserved(uri,str);
    if ((iVar3 == 0) &&
       ((uVar7 = bVar1 - 0x21, 0x1f < uVar7 ||
        (((0x96000fe9U >> (uVar7 & 0x1f) & 1) == 0 &&
         (((uVar7 != 4 ||
           ((9 < (byte)(str[1] - 0x30U) &&
            ((uVar7 = (byte)str[1] - 0x41, 0x25 < uVar7 ||
             ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) == 0)))))) ||
          ((9 < (byte)(str[2] - 0x30U) &&
           ((uVar7 = (byte)str[2] - 0x41, 0x25 < uVar7 ||
            ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) == 0)))))))))))) {
      if (uri != (xmlURIPtr)0x0) {
        if (uri->path != (char *)0x0) {
          (*xmlFree)(uri->path);
        }
        uri->path = (char *)0x0;
      }
    }
    else {
      bVar2 = false;
      local_38 = (xmlChar *)str;
      iVar3 = xmlParse3986Segment(uri,(char **)&local_38,':',0);
      if (iVar3 == 0) {
        bVar2 = false;
        do {
          pxVar5 = local_38;
          if (*local_38 != '/') {
            iVar3 = (int)local_38;
            if (uri != (xmlURIPtr)0x0) {
              if (uri->path != (char *)0x0) {
                (*xmlFree)(uri->path);
              }
              if (pxVar5 == (xmlChar *)str) {
                uri->path = (char *)0x0;
              }
              else {
                iVar3 = iVar3 - (int)str;
                if ((uri->cleanup & 2) == 0) {
                  pxVar6 = (xmlChar *)xmlURIUnescapeString(str,iVar3,(char *)0x0);
                }
                else {
                  pxVar6 = xmlStrndup((xmlChar *)str,iVar3);
                }
                uri->path = (char *)pxVar6;
                if (pxVar6 == (xmlChar *)0x0) {
                  iVar3 = -1;
                  bVar2 = false;
                  break;
                }
              }
            }
            local_48 = pxVar5;
            iVar3 = 0;
            bVar2 = true;
            break;
          }
          local_38 = local_38 + 1;
          iVar3 = 1;
          iVar4 = xmlParse3986Segment(uri,(char **)&local_38,'\0',1);
        } while (iVar4 == 0);
      }
      else {
        iVar3 = 1;
      }
      if (!bVar2) goto LAB_00151881;
    }
  }
  if (*local_48 == '?') {
    local_48 = local_48 + 1;
    iVar3 = xmlParse3986Query(uri,(char **)&local_48);
    if (iVar3 != 0) goto LAB_00151881;
  }
  if (*local_48 == '#') {
    local_48 = local_48 + 1;
    iVar3 = xmlParse3986Fragment(uri,(char **)&local_48);
    if (iVar3 != 0) goto LAB_00151881;
  }
  if (*local_48 == '\0') {
    iVar3 = 0;
  }
  else {
    xmlCleanURI(uri);
    iVar3 = 1;
  }
LAB_00151881:
  iVar4 = 0;
  if (iVar3 != 0) {
    xmlCleanURI(uri);
    iVar4 = iVar3;
  }
  return iVar4;
}

Assistant:

static int
xmlParse3986URIReference(xmlURIPtr uri, const char *str) {
    int ret;

    if (str == NULL)
	return(-1);
    xmlCleanURI(uri);

    /*
     * Try first to parse absolute refs, then fallback to relative if
     * it fails.
     */
    ret = xmlParse3986URI(uri, str);
    if (ret < 0)
        return(ret);
    if (ret != 0) {
	xmlCleanURI(uri);
        ret = xmlParse3986RelativeRef(uri, str);
	if (ret != 0) {
	    xmlCleanURI(uri);
	    return(ret);
	}
    }
    return(0);
}